

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_exception_what_method_decl
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool external)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  bool external_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  std::operator<<(out,"const char* ");
  if (external) {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar2 = std::operator<<(out,(string *)CONCAT44(extraout_var,iVar1));
    std::operator<<(poVar2,"::");
  }
  std::operator<<(out,"what() const noexcept");
  if (!external) {
    std::operator<<(out," override");
  }
  return;
}

Assistant:

void t_cpp_generator::generate_exception_what_method_decl(std::ostream& out,
                                                          t_struct* tstruct,
                                                          bool external) {
  out << "const char* ";
  if (external) {
    out << tstruct->get_name() << "::";
  }
  out << "what() const noexcept";
  if(!external)
    out << " override";
}